

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

void __thiscall
Js::InlineCache::CopyTo
          (InlineCache *this,PropertyId propertyId,ScriptContext *scriptContext,InlineCache *clone)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  VerifyRegistrationForInvalidation(this,scriptContext,propertyId);
  VerifyRegistrationForInvalidation(clone,scriptContext,propertyId);
  if (clone == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x1e4,"(clone != nullptr)","clone != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((this->invalidationListSlotPtr != (InlineCache **)0x0) &&
     (clone->invalidationListSlotPtr == (InlineCache **)0x0)) {
    if (((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x1) ==
         (undefined1  [24])0x0) && (((this->u).accessor.field_1.rawUInt16 & 0xb) != 0xb)) {
      pTVar1 = (this->u).local.typeWithoutProperty;
      if ((byte)((~(uint)pTVar1 & 0xd) == 0 |
                pTVar1 != (Type *)0x0 & *(byte *)((long)&this->u + 0x10)) == 1) {
        ScriptContext::RegisterStoreFieldInlineCache(scriptContext,clone,propertyId);
      }
    }
    else {
      ScriptContext::RegisterProtoInlineCache(scriptContext,clone,propertyId);
    }
  }
  if ((this->u).proto.prototypeObject != (clone->u).proto.prototypeObject ||
      *(undefined1 (*) [16])&this->u != *(undefined1 (*) [16])&clone->u) {
    (clone->u).proto.prototypeObject = (this->u).proto.prototypeObject;
    pTVar1 = (this->u).local.typeWithoutProperty;
    (clone->u).local.type = (this->u).local.type;
    (clone->u).local.typeWithoutProperty = pTVar1;
  }
  VerifyRegistrationForInvalidation(clone,scriptContext,propertyId);
  return;
}

Assistant:

void InlineCache::CopyTo(PropertyId propertyId, ScriptContext * scriptContext, InlineCache * const clone)
    {
        DebugOnly(VerifyRegistrationForInvalidation(this, scriptContext, propertyId));
        DebugOnly(VerifyRegistrationForInvalidation(clone, scriptContext, propertyId));
        Assert(clone != nullptr);

        // Note, the Register methods can throw due to OOM, so we need to do it before the inline cache is copied below.
        if (this->invalidationListSlotPtr != nullptr && clone->invalidationListSlotPtr == nullptr)
        {
            if (this->NeedsToBeRegisteredForProtoInvalidation())
            {
                scriptContext->RegisterProtoInlineCache(clone, propertyId);
            }
            else if (this->NeedsToBeRegisteredForStoreFieldInvalidation())
            {
                scriptContext->RegisterStoreFieldInlineCache(clone, propertyId);
            }
        }

#if DBG
        // inline cache pages might been locked after ZeroAll
        if (memcmp(&clone->u, &this->u, sizeof(this->u)) != 0)
#endif
        {
            clone->u = this->u;
        }

        DebugOnly(VerifyRegistrationForInvalidation(clone, scriptContext, propertyId));
    }